

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CArmInstruction.cpp
# Opt level: O3

void __thiscall CArmInstruction::FormatOpcode(CArmInstruction *this,char *Dest,char *Source)

{
  char cVar1;
  byte bVar2;
  uchar *puVar3;
  char *pcVar4;
  char (*__src) [3];
  
  do {
    bVar2 = *Source;
    if (bVar2 < 0x53) {
      if (bVar2 == 0x41) {
        puVar3 = "\x03\x01\x02";
        if (((uint)(this->Opcode).flags >> 0xb & 1) == 0) {
          puVar3 = "\x03\x01\x02";
        }
        __src = ArmAddressingModes + puVar3[(this->Vars).Opcode.a];
      }
      else {
        if (bVar2 != 0x43) {
          if (bVar2 == 0) {
            *Dest = 0;
            return;
          }
LAB_00162f7d:
          *Dest = bVar2;
          goto LAB_00162f7f;
        }
        __src = ArmConditions + (this->Vars).Opcode.c;
      }
      pcVar4 = stpcpy(Dest,*__src);
      Dest = (char *)((byte *)Dest + ((int)pcVar4 - (int)Dest));
    }
    else {
      if (bVar2 == 0x53) {
        if ((this->Vars).Opcode.s != true) goto LAB_00162f82;
        *Dest = 0x73;
      }
      else {
        if (bVar2 == 0x58) {
          cVar1 = (this->Vars).Opcode.x;
        }
        else {
          if (bVar2 != 0x59) goto LAB_00162f7d;
          cVar1 = (this->Vars).Opcode.y;
        }
        bVar2 = 0x62;
        if (cVar1 != '\0') {
          bVar2 = 0x74;
        }
        *Dest = bVar2;
      }
LAB_00162f7f:
      Dest = (char *)((byte *)Dest + 1);
    }
LAB_00162f82:
    Source = (char *)((byte *)Source + 1);
  } while( true );
}

Assistant:

void CArmInstruction::FormatOpcode(char* Dest, const char* Source) const
{
	while (*Source != 0)
	{
		switch (*Source)
		{
		case 'C':	// condition
			Dest += sprintf(Dest,"%s",ArmConditions[Vars.Opcode.c]);
			Source++;
			break;
		case 'S':	// set flag
			if (Vars.Opcode.s) *Dest++ = 's';
			Source++;
			break;
		case 'A':	// addressing mode
			if (Opcode.flags & ARM_LOAD)
			{
				Dest += sprintf(Dest,"%s",ArmAddressingModes[LdmModes[Vars.Opcode.a]]);
			} else {
				Dest += sprintf(Dest,"%s",ArmAddressingModes[StmModes[Vars.Opcode.a]]);
			}
			Source++;
			break;
		case 'X':	// x flag
			if (!Vars.Opcode.x) *Dest++ = 'b';
			else *Dest++ = 't';
			Source++;
			break;
		case 'Y':	// y flag
			if (!Vars.Opcode.y) *Dest++ = 'b';
			else *Dest++ = 't';
			Source++;
			break;
		default:
			*Dest++ = *Source++;
			break;
		}
	}
	*Dest = 0;
}